

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void draw_map(wchar_t cx,wchar_t cy)

{
  nh_dbuf_entry *pnVar1;
  nh_dbuf_entry (*panVar2) [80];
  attr_t aVar3;
  attr_t extra_attrs;
  long lVar4;
  ulong uVar5;
  wchar_t bg_color;
  curses_symdef syms [4];
  wchar_t local_e4;
  long local_e0;
  int local_d8;
  int local_d4;
  long local_d0;
  curses_symdef_conflict local_c8 [4];
  
  if (mapwin != (WINDOW *)0x0 && display_buffer != (nh_dbuf_entry (*) [80])0x0) {
    local_d4 = (int)mapwin->_cury;
    local_d8 = (int)mapwin->_curx;
    lVar4 = 0x18;
    local_e0 = 0;
    do {
      uVar5 = 0;
      local_d0 = lVar4;
      do {
        panVar2 = display_buffer;
        local_e4 = L'\0';
        pnVar1 = *display_buffer;
        wmove(mapwin,local_e0,uVar5 & 0xffffffff);
        mapglyph((nh_dbuf_entry_conflict *)((long)&pnVar1->effect + lVar4),local_c8,&local_e4);
        if (((settings.hilite_pet == '\0') ||
            ((*(byte *)((long)&(*panVar2)[0].monflags + lVar4) & 1) == 0)) &&
           ((settings.hilite_peaceful == '\0' ||
            ((*(byte *)((long)&(*panVar2)[0].monflags + lVar4) & 0x10) == 0)))) {
          aVar3 = 0;
          extra_attrs = 0;
          if ((((local_e4 == L'\0') &&
               (extra_attrs = 0, *(short *)((long)&(*panVar2)[0].mon + lVar4) == 0)) &&
              (extra_attrs = aVar3, (&(*panVar2)[0].invis)[lVar4] == '\0')) &&
             ((*(short *)((long)&(*panVar2)[0].obj + lVar4) != 0 &&
              ((*(byte *)((long)&(*panVar2)[0].objflags + lVar4) & 1) != 0)))) goto LAB_0010be86;
        }
        else {
LAB_0010be86:
          local_e4 = L'\0';
          extra_attrs = 0x40000;
        }
        print_sym((WINDOW_conflict *)mapwin,local_c8,extra_attrs,local_e4);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar5 != 0x4f);
      local_e0 = local_e0 + 1;
      lVar4 = local_d0 + 0x780;
    } while (local_e0 != 0x15);
    wmove(mapwin,local_d4,local_d8);
    wnoutrefresh(mapwin);
  }
  return;
}

Assistant:

void draw_map(int cx, int cy)
{
    int x, y, symcount, cursx, cursy;
    attr_t attr;
    unsigned int frame;
    struct curses_symdef syms[4];

    if (!display_buffer || !mapwin)
	return;

    getyx(mapwin, cursy, cursx);

    frame = 0;

    for (y = 0; y < ROWNO; y++) {
	for (x = 1; x < COLNO; x++) {
	    int bg_color = 0;
	    struct nh_dbuf_entry *dbe = &display_buffer[y][x];

	    /* set the position for each character to prevent incorrect
	     * positioning due to charset issues (IBM chars on a unicode term
	     * or vice versa) */
	    wmove(mapwin, y, x-1);

	    symcount = mapglyph(dbe, syms, &bg_color);
	    attr = A_NORMAL;
	    if ((settings.hilite_pet && (dbe->monflags & MON_TAME)) ||
		(settings.hilite_peaceful && (dbe->monflags & MON_PEACEFUL)) ||
		/* reverse object piles, but don't override stair background
		 * or monsters on top */
		(bg_color == 0 && !dbe->mon && !dbe->invis &&
		 dbe->obj && (dbe->objflags & DOBJ_STACKS))) {
		attr |= A_REVERSE;
		bg_color = 0;
	    }

	    print_sym(mapwin, &syms[frame % symcount], attr, bg_color);
	}
    }

    wmove(mapwin, cursy, cursx);
    wnoutrefresh(mapwin);
}